

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O3

int __thiscall piksel::Font::load(Font *this,string *filename)

{
  int iVar1;
  FILE *__stream;
  size_t __size;
  uchar *fontBuffer;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  fseek(__stream,0,2);
  __size = ftell(__stream);
  fseek(__stream,0,0);
  fontBuffer = (uchar *)malloc(__size);
  fread(fontBuffer,__size,1,__stream);
  fclose(__stream);
  iVar1 = _load(this,fontBuffer);
  return iVar1;
}

Assistant:

int Font::load(std::string filename) {
    long size;
    unsigned char* fontBuffer;
    FILE* fontFile = fopen(filename.c_str(), "rb");
    fseek(fontFile, 0, SEEK_END);
    size = ftell(fontFile);
    fseek(fontFile, 0, SEEK_SET);
    fontBuffer = (unsigned char *) malloc(size);
    fread(fontBuffer, size, 1, fontFile);
    fclose(fontFile);
    return _load(fontBuffer);
}